

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O1

void __thiscall baryonyx::bit_array_impl::set(bit_array_impl *this,int index)

{
  ulong *puVar1;
  
  if ((-1 < index) && (index < this->m_size)) {
    puVar1 = (this->m_data)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + ((uint)index >> 6);
    *puVar1 = *puVar1 | 1L << ((ulong)(uint)index & 0x3f);
    return;
  }
  set();
}

Assistant:

void set(int index) noexcept
    {
        bx_assert(index >= 0 && index < m_size);

        m_data[b_index(index)] |= k_one << b_offset(index);
    }